

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmDefinitions> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pointer puVar5;
  pointer pPVar6;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar7;
  pointer pcVar8;
  StackIter begin;
  StackIter end;
  StackIter begin_00;
  StackIter end_00;
  cmStateSnapshot *pcVar9;
  PointerType pBVar10;
  PointerType pSVar11;
  string *psVar12;
  PointerType pcVar13;
  mapped_type *pmVar14;
  iterator iVar15;
  iterator it;
  PositionType pos;
  string binDir;
  undefined1 local_a8 [32];
  iterator local_88;
  string local_78;
  string local_58;
  cmStateSnapshot *local_38;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&this->GlobalProperties);
  std::
  _Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear((_Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           *)this);
  cmGlobVerificationManager::Reset(this->GlobVerificationManager);
  local_88 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Truncate(&this->ExecutionListFiles);
  local_a8._0_16_ =
       (undefined1  [16])
       cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                 (&this->BuildsystemDirectory);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->IncludeDirectories,
                    (pBVar10->IncludeDirectories).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar10->IncludeDirectoryBacktraces);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->CompileDefinitions,
                    (pBVar10->CompileDefinitions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar10->CompileDefinitionsBacktraces);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->CompileOptions,
                    (pBVar10->CompileOptions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar10->CompileOptionsBacktraces);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->LinkOptions,
                    (pBVar10->LinkOptions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar10->LinkOptionsBacktraces);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->LinkDirectories,
                    (pBVar10->LinkDirectories).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar10->LinkDirectoriesBacktraces);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  (pBVar10->DirectoryEnd).Tree = local_88.Tree;
  (pBVar10->DirectoryEnd).Position = local_88.Position;
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->NormalTargetNames,
                    (pBVar10->NormalTargetNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&pBVar10->Properties);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_a8);
  pcVar4 = (pBVar10->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pBVar10->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar4) {
    (pBVar10->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar4;
  }
  puVar5 = (this->PolicyStack).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->PolicyStack).UpPositions.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->PolicyStack).UpPositions.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  pcVar7 = &this->PolicyStack;
  pPVar6 = (this->PolicyStack).Data.
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->PolicyStack).Data.
      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar6) {
    (this->PolicyStack).Data.
    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar6;
  }
  pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
  (pSVar11->Policies).Tree = pcVar7;
  (pSVar11->Policies).Position = 0;
  pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
  (pSVar11->PolicyRoot).Tree = pcVar7;
  (pSVar11->PolicyRoot).Position = 0;
  pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
  (pSVar11->PolicyScope).Tree = pcVar7;
  (pSVar11->PolicyScope).Position = 0;
  pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
  pcVar7 = (pSVar11->Policies).Tree;
  if ((pcVar7 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
     ((pSVar11->Policies).Position <=
      (ulong)(((long)(pcVar7->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar7->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555))) {
    pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
    pcVar7 = (pSVar11->PolicyRoot).Tree;
    if ((pcVar7 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
       ((pSVar11->PolicyRoot).Position <=
        (ulong)(((long)(pcVar7->Data).
                       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar7->Data).
                       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555))) {
      paVar1 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      local_38 = __return_storage_ptr__;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_SOURCE_DIR","");
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      begin.Tree = (pSVar11->Vars).Tree;
      begin.Position = (pSVar11->Vars).Position;
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      end.Tree = (pSVar11->Root).Tree;
      end.Position = (pSVar11->Root).Position;
      psVar12 = cmDefinitions::Get(&local_78,begin,end);
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_a8 + 0x10);
      local_a8._0_8_ = pcVar2;
      pcVar8 = (psVar12->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,pcVar8,pcVar8 + psVar12->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_BINARY_DIR","");
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      begin_00.Tree = (pSVar11->Vars).Tree;
      begin_00.Position = (pSVar11->Vars).Position;
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      end_00.Tree = (pSVar11->Root).Tree;
      end_00.Position = (pSVar11->Root).Position;
      psVar12 = cmDefinitions::Get(&local_58,begin_00,end_00);
      pcVar8 = (psVar12->_M_dataplus)._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar8,pcVar8 + psVar12->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar3) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      this_00 = &this->VarTree;
      cmLinkedTree<cmDefinitions>::Clear(this_00);
      iVar15.Position = 0;
      iVar15.Tree = this_00;
      iVar15 = cmLinkedTree<cmDefinitions>::Push(this_00,iVar15);
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      pSVar11->Vars = iVar15;
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      (pSVar11->Parent).Tree = this_00;
      (pSVar11->Parent).Position = 0;
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      (pSVar11->Root).Tree = this_00;
      (pSVar11->Root).Position = 0;
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      pcVar13 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar11->Vars);
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_SOURCE_DIR","");
      cmDefinitions::Set(pcVar13,&local_58,(char *)local_a8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar3) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_88);
      pcVar13 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar11->Vars);
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_BINARY_DIR","");
      cmDefinitions::Set(pcVar13,&local_58,local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar3) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ != pcVar2) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RULE_LAUNCH_COMPILE","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_a8,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ != pcVar2) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RULE_LAUNCH_LINK","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_a8,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ != pcVar2) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RULE_LAUNCH_CUSTOM","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_a8,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ != pcVar2) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RULE_LAUNCH_COMPILE","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_a8,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ != pcVar2) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RULE_LAUNCH_LINK","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_a8,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ != pcVar2) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RULE_LAUNCH_CUSTOM","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_a8,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ != pcVar2) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      pcVar9 = local_38;
      cmStateSnapshot::cmStateSnapshot(local_38,this,local_88);
      return pcVar9;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x12d,"cmStateSnapshot cmState::Reset()");
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,300,"cmStateSnapshot cmState::Reset()");
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();
  this->GlobVerificationManager->Reset();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->IncludeDirectoryBacktraces.clear();
    it->CompileDefinitions.clear();
    it->CompileDefinitionsBacktraces.clear();
    it->CompileOptions.clear();
    it->CompileOptionsBacktraces.clear();
    it->LinkOptions.clear();
    it->LinkOptionsBacktraces.clear();
    it->LinkDirectories.clear();
    it->LinkDirectoriesBacktraces.clear();
    it->DirectoryEnd = pos;
    it->NormalTargetNames.clear();
    it->Properties.clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      *cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      *cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir.c_str());
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir.c_str());
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return cmStateSnapshot(this, pos);
}